

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ReadObjectValue(BCReaderState *s)

{
  JSContext *ctx;
  int iVar1;
  JSValueUnion JVar2;
  JSRefCountHeader *p_1;
  uint uVar3;
  JSRefCountHeader *p;
  JSValue val;
  JSValue v;
  
  ctx = s->ctx;
  val = JS_ReadObjectRec(s);
  JVar2 = val.u;
  uVar3 = (uint)val.tag;
  if (uVar3 == 6) {
    v = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    v = JS_ToObject(ctx,val);
    if (((int)v.tag != 6) && (iVar1 = BC_add_object_ref1(s,(JSObject *)v.u.ptr), iVar1 == 0)) {
      if (uVar3 < 0xfffffff5) {
        return v;
      }
      iVar1 = *JVar2.ptr;
      *(int *)JVar2.ptr = iVar1 + -1;
      if (1 < iVar1) {
        return v;
      }
      __JS_FreeValueRT(ctx->rt,val);
      return v;
    }
  }
  if ((0xfffffff4 < uVar3) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,val);
  }
  if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *v.u.ptr, *(int *)v.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_ReadObjectValue(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue val, obj = JS_UNDEFINED;

    val = JS_ReadObjectRec(s);
    if (JS_IsException(val))
        goto fail;
    obj = JS_ToObject(ctx, val);
    if (JS_IsException(obj))
        goto fail;
    if (BC_add_object_ref(s, obj))
        goto fail;
    JS_FreeValue(ctx, val);
    return obj;
 fail:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}